

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O2

bool apngasm::spec::priv::anon_unknown_0::str2delay(string *str,Delay *pOut)

{
  bool bVar1;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (pOut != (Delay *)0x0) {
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (str,'/',0);
    if (__n == 0xffffffffffffffff) {
      bVar1 = s2u(str,&pOut->num);
      if (bVar1) {
        pOut->den = 1000;
        return true;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_38,str,0,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&bStack_58,str,__n + 1,str->_M_string_length);
      bVar1 = s2u(&local_38,&pOut->num);
      if ((bVar1) && (bVar1 = s2u(&bStack_58,&pOut->den), bVar1)) {
        std::__cxx11::string::~string((string *)&bStack_58);
        std::__cxx11::string::~string((string *)&local_38);
        return true;
      }
      std::__cxx11::string::~string((string *)&bStack_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return false;
}

Assistant:

bool str2delay(const std::string& str, Delay* pOut)
        {
          if(pOut == NULL)
            return false;

          static const char delimiter = '/';
          const std::string::size_type index = str.find(delimiter, 0);

          // Numerator only.
          if(index == std::string::npos)
          {
            if( !s2u(str, &pOut->num) )
              return false;
            pOut->den = DEFAULT_FRAME_DENOMINATOR;
          }

          // Numerator / Denominator
          else
          {
            const std::string& num = str.substr(0, index);
            const std::string& den = str.substr(index+1, str.length());

            if( !s2u(num, &pOut->num) || !s2u(den, &pOut->den) )
              return false;
          }

          return true;
        }